

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertable_log.c
# Opt level: O2

int mpt_convertable_vlog(mpt_convertable *dest,char *src,int type,char *fmt,__va_list_tag *va)

{
  int iVar1;
  mpt_logger *pmVar2;
  undefined8 *local_38;
  mpt_output *out;
  
  if (dest == (mpt_convertable *)0x0) {
    pmVar2 = mpt_log_default();
    if (pmVar2 != (mpt_logger *)0x0) {
      iVar1 = (*pmVar2->_vptr->log)(pmVar2,src,type,fmt,va);
      return iVar1;
    }
  }
  else {
    local_38 = (undefined8 *)0x0;
    iVar1 = (*dest->_vptr->convert)(dest,0x81,&local_38);
    if (iVar1 < 1) {
      out = (mpt_output *)0x0;
      iVar1 = (*dest->_vptr->convert)(dest,0x83,&out);
      if (iVar1 < 1) {
        return -3;
      }
      if (out != (mpt_output *)0x0) {
        iVar1 = mpt_output_vlog(out,src,type,fmt,va);
        return iVar1;
      }
    }
    else if (local_38 != (undefined8 *)0x0) {
      iVar1 = (**(code **)*local_38)(local_38,src,type,fmt,va);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

__MPT_NAMESPACE_BEGIN

/*!
 * \ingroup mptOutput
 * \brief log to convertable
 * 
 * Use convertable as target for log message.
 * 
 * \param dest metatype instance
 * \param src  originating location
 * \param type message type and flags
 * \param fmt  log arguments format string
 * \param va   argument list
 * 
 * \return lor operation result
 */
int mpt_convertable_vlog(MPT_INTERFACE(convertable) *dest, const char *src, int type, const char *fmt, va_list va)
{
	MPT_INTERFACE(output) *out;
	MPT_INTERFACE(logger) *log;
	
	if (!dest) {
		if (!(log  = mpt_log_default())) {
			return 0;
		}
		return log->_vptr->log(log, src, type, fmt, va);
	}
	log = 0;
	if (dest->_vptr->convert(dest, MPT_ENUM(TypeLoggerPtr), &log) > 0) {
		if (!log) {
			return 0;
		}
		return log->_vptr->log(log, src, type, fmt, va);
	}
	out = 0;
	if (dest->_vptr->convert(dest, MPT_ENUM(TypeOutputPtr), &out) > 0) {
		if (!out) {
			return 0;
		}
		return mpt_output_vlog(out, src, type, fmt, va);
	}
	return MPT_ERROR(BadType);
}